

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pk_gen.c
# Opt level: O2

void pk_retrieve_8cols(uchar *cols_out,uint col,uchar *inv,gf *g,gf *L)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  gf gVar8;
  int i;
  byte bVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  uchar *puVar13;
  uchar *puVar14;
  uint uVar15;
  byte bVar16;
  long lVar17;
  int iVar18;
  uchar cols_hat_H [96];
  uchar tmp [768];
  
  puVar13 = tmp;
  for (lVar17 = 0; lVar17 != 8; lVar17 = lVar17 + 1) {
    uVar15 = (int)lVar17 + col ^ 7;
    gVar8 = eval(g,L[uVar15]);
    gVar8 = gf_inv(gVar8);
    for (lVar11 = 0; lVar11 != 0x60; lVar11 = lVar11 + 1) {
      cols_hat_H[lVar11] = '\0';
    }
    bVar16 = 0;
    lVar12 = 0;
    lVar11 = 8;
    for (iVar18 = 0; iVar18 != 0x40; iVar18 = iVar18 + 1) {
      for (iVar10 = 0; iVar10 != 0xc; iVar10 = iVar10 + 1) {
        if (lVar11 == 0) {
          cols_hat_H[lVar12] = bVar16;
          lVar12 = lVar12 + 1;
          bVar16 = 0;
          lVar11 = 8;
        }
        bVar16 = bVar16 >> 1 | (char)(gVar8 >> ((byte)iVar10 & 0x1f)) << 7;
        lVar11 = lVar11 + -1;
      }
      gVar8 = gf_mul(gVar8,L[uVar15]);
    }
    if (lVar11 == 0) {
      cols_hat_H[lVar12] = bVar16;
    }
    for (lVar11 = -0x60; lVar11 != 0; lVar11 = lVar11 + 1) {
      puVar13[lVar11 + 0x60] = '\0';
    }
    puVar14 = inv;
    for (uVar15 = 0; uVar15 != 0x300; uVar15 = uVar15 + 1) {
      bVar16 = 0;
      for (lVar11 = 0; lVar11 != 0x60; lVar11 = lVar11 + 1) {
        bVar16 = bVar16 ^ cols_hat_H[lVar11] & puVar14[lVar11];
      }
      bVar16 = bVar16 >> 4 ^ bVar16;
      bVar16 = bVar16 >> 2 ^ bVar16;
      tmp[(ulong)(uVar15 >> 3) + lVar17 * 0x60] =
           tmp[(ulong)(uVar15 >> 3) + lVar17 * 0x60] |
           ((bVar16 >> 1 ^ bVar16) & 1) << ((byte)uVar15 & 7);
      puVar14 = puVar14 + 0x60;
    }
    puVar13 = puVar13 + 0x60;
  }
  for (lVar17 = 0; lVar17 != 0x60; lVar17 = lVar17 + 1) {
    bVar16 = tmp[lVar17];
    bVar1 = tmp[lVar17 + 0x60];
    bVar2 = tmp[lVar17 + 0xc0];
    bVar3 = tmp[lVar17 + 0x120];
    bVar4 = tmp[lVar17 + 0x180];
    bVar5 = tmp[lVar17 + 0x1e0];
    bVar6 = tmp[lVar17 + 0x240];
    bVar7 = tmp[lVar17 + 0x2a0];
    for (lVar11 = 0; lVar11 != 8; lVar11 = lVar11 + 1) {
      bVar9 = (byte)lVar11;
      uVar15 = (uint)lVar11;
      cols_out[lVar11] =
           (bVar6 >> (bVar9 & 0x1f) & 1) * '\x02' +
           ((bVar4 >> (bVar9 & 0x1f) & 1) * '\x02' +
            ((bVar3 >> (uVar15 & 0x1f) & 1) != 0 |
            (bVar2 >> (bVar9 & 0x1f) & 1) * '\x02' +
            (((bVar1 >> (uVar15 & 0x1f) & 1) != 0) + (bVar16 >> (bVar9 & 0x1f) & 1) * '\x02') *
            '\x04') * '\x04' | (bVar5 >> (uVar15 & 0x1f) & 1) != 0) * '\x04' |
           (bVar7 >> (uVar15 & 0x1f) & 1) != 0;
    }
    cols_out = cols_out + 8;
  }
  return;
}

Assistant:

void pk_retrieve_8cols(unsigned char *cols_out, unsigned int col, unsigned char *inv, gf *g, gf *L)
{
  unsigned char b;
  unsigned char tmp[SYS_T * GFBITS];
  unsigned char cols_hat_H[SYS_T * GFBITS/8];

  // compute 8 columns of \hat{H} and multiply by the inverse to obtain the pubkey columns
  for(int j = 0; j < 8; j++)
  {
    gen_hat_H_col(cols_hat_H, col+j, g, L);
    mat_vec_mul(tmp + (SYS_T*GFBITS/8) * j, inv, SYS_T * GFBITS, SYS_T * GFBITS, cols_hat_H);
  }

  // reassamble the 8 bit columns into the corresponding bytes
  for(int i = 0; i < SYS_T*GFBITS/8; i++)
    for(int j = 0; j < 8; j++)
    {
      b  = (tmp[SYS_T*GFBITS/8 * 0 + i] >> j) & 1; b <<= 1;
      b |= (tmp[SYS_T*GFBITS/8 * 1 + i] >> j) & 1; b <<= 1;
      b |= (tmp[SYS_T*GFBITS/8 * 2 + i] >> j) & 1; b <<= 1;
      b |= (tmp[SYS_T*GFBITS/8 * 3 + i] >> j) & 1; b <<= 1;
      b |= (tmp[SYS_T*GFBITS/8 * 4 + i] >> j) & 1; b <<= 1;
      b |= (tmp[SYS_T*GFBITS/8 * 5 + i] >> j) & 1; b <<= 1;
      b |= (tmp[SYS_T*GFBITS/8 * 6 + i] >> j) & 1; b <<= 1;
      b |= (tmp[SYS_T*GFBITS/8 * 7 + i] >> j) & 1;

      cols_out[i*8 + j] = b;
    }
}